

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *this,int num_values,
          int num_items,DblSuffixHandler *handler)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < num_values) {
    iVar1 = num_values;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadUInt
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *)this,num_items);
    TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  }
  return;
}

Assistant:

void ReadSuffixValues(int num_values, int num_items, SuffixHandler &handler) {
    ValueReader read;
    for (int i = 0; i < num_values; ++i) {
      int index = ReadUInt(num_items);
      handler.SetValue(index, read(reader_));
      reader_.ReadTillEndOfLine();
    }
  }